

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::bandSolve(Matrix *this,Matrix *A,Matrix *b,int k)

{
  double dVar1;
  int iVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double **ppdVar7;
  double **ppdVar8;
  ulong uVar9;
  domain_error *this_00;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  double dVar17;
  Matrix MVar18;
  
  uVar13 = A->rows_;
  lVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar13) {
    uVar9 = (ulong)uVar13;
  }
  lVar12 = 1;
  uVar15 = 0;
  do {
    if (uVar15 == uVar9) {
      Matrix(this,b->rows_,1);
      ppdVar3 = b->p;
      iVar2 = this->rows_;
      ppdVar7 = A->p;
      ppdVar8 = this->p;
      *ppdVar8[(long)iVar2 + -1] =
           *ppdVar3[(long)iVar2 + -1] / ppdVar7[(long)iVar2 + -1][(long)iVar2 + -1];
      for (uVar13 = iVar2 - 2; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
        uVar15 = (ulong)uVar13;
        iVar16 = 0;
        uVar9 = uVar15;
        while( true ) {
          uVar9 = uVar9 + 1;
          if (iVar2 <= (int)uVar9) break;
          iVar16 = (int)(ppdVar7[uVar15][uVar9] * *ppdVar8[uVar9] + (double)iVar16);
        }
        *ppdVar8[uVar15] = (*ppdVar3[uVar15] - (double)iVar16) / ppdVar7[uVar15][uVar15];
      }
      MVar18.p = ppdVar7;
      MVar18._0_8_ = this;
      return MVar18;
    }
    ppdVar3 = A->p;
    pdVar4 = ppdVar3[uVar15];
    if ((pdVar4[uVar15] == 0.0) && (!NAN(pdVar4[uVar15]))) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,
                 "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again."
                );
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
    for (lVar11 = lVar12;
        ((int)lVar11 < (int)uVar13 && ((long)(int)lVar11 <= (long)(uVar15 + (long)((k + -1) / 2))));
        lVar11 = lVar11 + 1) {
      iVar2 = A->cols_;
      pdVar5 = ppdVar3[lVar11];
      for (lVar14 = 1; (int)uVar15 + (int)lVar14 < iVar2; lVar14 = lVar14 + 1) {
        dVar1 = *(double *)((long)pdVar5 + lVar14 * 8 + lVar10);
        dVar17 = pdVar4[uVar15];
        if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_0011bffd;
        *(double *)((long)pdVar5 + lVar14 * 8 + lVar10) =
             dVar1 - (pdVar5[uVar15] / dVar17) * *(double *)((long)pdVar4 + lVar14 * 8 + lVar10);
      }
      dVar17 = pdVar4[uVar15];
LAB_0011bffd:
      pdVar6 = b->p[lVar11];
      *pdVar6 = *pdVar6 - (pdVar5[uVar15] / dVar17) * *b->p[uVar15];
      pdVar5[uVar15] = 0.0;
    }
    uVar15 = uVar15 + 1;
    lVar12 = lVar12 + 1;
    lVar10 = lVar10 + 8;
  } while( true );
}

Assistant:

Matrix Matrix::bandSolve(Matrix A, Matrix b, int k)
{
    // optimized Gaussian elimination
    int bandsBelow = (k - 1) / 2;
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw exception
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_ && j <= i + bandsBelow; ++j) {
            int k = i + 1;
            while (k < A.cols_ && A.p[j][k]) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                k++;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
    }

    return x;
}